

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
* __thiscall
soul::heart::Function::getAllLocalVariables
          (vector<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
           *__return_storage_ptr__,Function *this)

{
  pointer ppVar1;
  bool bVar2;
  Statement *object;
  Assignment *pAVar3;
  Expression *pEVar4;
  Variable *pVVar5;
  pool_ref<soul::heart::Block> *b;
  pointer ppVar6;
  Iterator __begin3;
  pool_ptr<soul::heart::Variable> v;
  pool_ptr<const_soul::heart::Assignment> a;
  Iterator local_50;
  pool_ref<soul::heart::Variable> local_48;
  pool_ptr<soul::heart::Variable> local_40;
  long local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar1 = (this->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar6 = (this->blocks).
                super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar1; ppVar6 = ppVar6 + 1) {
    local_50.object = (ppVar6->object->statements).firstObject;
    while (local_50.object != (Statement *)0x0) {
      object = LinkedList<soul::heart::Statement>::Iterator::operator*(&local_50);
      cast<soul::heart::Assignment_const,soul::heart::Statement>((soul *)&local_38,object);
      if (local_38 != 0) {
        pAVar3 = pool_ptr<const_soul::heart::Assignment>::operator->
                           ((pool_ptr<const_soul::heart::Assignment> *)&local_38);
        if ((pAVar3->target).object != (Expression *)0x0) {
          pAVar3 = pool_ptr<const_soul::heart::Assignment>::operator->
                             ((pool_ptr<const_soul::heart::Assignment> *)&local_38);
          pEVar4 = pool_ptr<soul::heart::Expression>::operator->(&pAVar3->target);
          (*(pEVar4->super_Object)._vptr_Object[6])(&local_40,pEVar4);
          if (local_40.object != (Variable *)0x0) {
            pVVar5 = pool_ptr<soul::heart::Variable>::operator->(&local_40);
            if (pVVar5->role != parameter) {
              pVVar5 = pool_ptr<soul::heart::Variable>::operator->(&local_40);
              if ((pVVar5->role & ~external) != state) {
                bVar2 = contains<std::vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>,soul::pool_ptr<soul::heart::Variable>&>
                                  (__return_storage_ptr__,&local_40);
                if (!bVar2) {
                  local_48.object = pool_ptr<soul::heart::Variable>::operator*(&local_40);
                  std::
                  vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
                  ::emplace_back<soul::pool_ref<soul::heart::Variable>>
                            ((vector<soul::pool_ref<soul::heart::Variable>,std::allocator<soul::pool_ref<soul::heart::Variable>>>
                              *)__return_storage_ptr__,&local_48);
                }
              }
            }
          }
        }
      }
      LinkedList<soul::heart::Statement>::Iterator::operator++(&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<pool_ref<Variable>> getAllLocalVariables() const
        {
            std::vector<pool_ref<Variable>> locals;

            for (auto& b : blocks)
                for (auto s : b->statements)
                    if (auto a = cast<const Assignment> (*s))
                        if (a->target != nullptr)
                            if (auto v = a->target->getRootVariable())
                                if (! (v->isParameter() || v->isState() || contains (locals, v)))
                                    locals.push_back (*v);

            return locals;
        }